

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O0

Pass * wasm::createOptimizeForJSPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x108);
  memset(this,0,0x108);
  OptimizeForJSPass::OptimizeForJSPass((OptimizeForJSPass *)this);
  return this;
}

Assistant:

Pass* createOptimizeForJSPass() { return new OptimizeForJSPass(); }